

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_set.hpp
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>,_bool>
 __thiscall
itlib::
flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
::insert<Rml::Element*&>
          (flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
           *this,Element **val)

{
  iterator t;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference u;
  void *extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  *__rhs;
  pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>,_bool>
  pVar4;
  byte local_52;
  bool local_51;
  const_iterator local_50;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_48;
  bool local_39;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_38;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_30;
  iterator i;
  Element **val_local;
  flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  *this_local;
  bool local_10;
  
  i._M_current = val;
  local_30._M_current = (Element **)lower_bound<Rml::Element*>(this,val);
  local_38._M_current =
       (Element **)
       flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
       ::end((flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
              *)this);
  __rhs = &local_38;
  bVar1 = __gnu_cxx::operator!=(&local_30,__rhs);
  local_52 = 0;
  if (bVar1) {
    iVar2 = flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
            ::cmp((flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                   *)this,__rhs,extraout_RDX);
    t = i;
    u = __gnu_cxx::
        __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
        ::operator*(&local_30);
    bVar1 = ({parm#1}<{parm#2})itlib::fsimpl::less::operator()
                      ((void *)CONCAT44(extraout_var,iVar2),t._M_current,u);
    local_52 = bVar1 ^ 0xff;
  }
  if ((local_52 & 1) == 0) {
    __gnu_cxx::
    __normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
    ::__normal_iterator<Rml::Element**>
              ((__normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
                *)&local_50,&local_30);
    local_48._M_current =
         (Element **)
         std::vector<Rml::Element*,std::allocator<Rml::Element*>>::emplace<Rml::Element*&>
                   ((vector<Rml::Element*,std::allocator<Rml::Element*>> *)this,local_50,
                    i._M_current);
    local_51 = true;
    std::
    pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>,_bool,_true>
              ((pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>,_bool>
                *)&this_local,&local_48,&local_51);
    uVar3 = extraout_RDX_01;
  }
  else {
    local_39 = false;
    std::
    pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>_&,_bool,_true>
              ((pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>,_bool>
                *)&this_local,&local_30,&local_39);
    uVar3 = extraout_RDX_00;
  }
  pVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  pVar4.second = local_10;
  pVar4.first._M_current = (Element **)this_local;
  return pVar4;
}

Assistant:

std::pair<iterator, bool> insert(P&& val)
    {
        auto i = lower_bound(val);
        if (i != end() && !cmp()(val, *i))
        {
            return { i, false };
        }

        return{ m_container.emplace(i, std::forward<P>(val)), true };
    }